

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  void *pvVar1;
  bool bVar2;
  reference ppvVar3;
  void **ppvVar4;
  size_t sVar5;
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this_local;
  
  DeallocateCustomSizedSlabs(this);
  SmallVectorImpl<std::pair<void_*,_unsigned_long>_>::clear
            (&(this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>);
  bVar2 = SmallVectorBase::empty((SmallVectorBase *)&this->Slabs);
  if (!bVar2) {
    this->BytesAllocated = 0;
    ppvVar3 = SmallVectorTemplateCommon<void_*,_void>::front
                        ((SmallVectorTemplateCommon<void_*,_void> *)&this->Slabs);
    this->CurPtr = (char *)*ppvVar3;
    this->End = this->CurPtr + 0x1000;
    ppvVar4 = std::next<void**>((void **)(this->Slabs).super_SmallVectorImpl<void_*>.
                                         super_SmallVectorTemplateBase<void_*,_true>.
                                         super_SmallVectorTemplateCommon<void_*,_void>.
                                         super_SmallVectorBase.BeginX,1);
    pvVar1 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>
             .super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    sVar5 = SmallVectorBase::size((SmallVectorBase *)&this->Slabs);
    DeallocateSlabs(this,ppvVar4,(iterator)((long)pvVar1 + sVar5 * 8));
    ppvVar4 = std::next<void**>((void **)(this->Slabs).super_SmallVectorImpl<void_*>.
                                         super_SmallVectorTemplateBase<void_*,_true>.
                                         super_SmallVectorTemplateCommon<void_*,_void>.
                                         super_SmallVectorBase.BeginX,1);
    pvVar1 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>
             .super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    sVar5 = SmallVectorBase::size((SmallVectorBase *)&this->Slabs);
    SmallVectorImpl<void_*>::erase
              (&(this->Slabs).super_SmallVectorImpl<void_*>,ppvVar4,
               (const_iterator)((long)pvVar1 + sVar5 * 8));
  }
  return;
}

Assistant:

void Reset() {
    // Deallocate all but the first slab, and deallocate all custom-sized slabs.
    DeallocateCustomSizedSlabs();
    CustomSizedSlabs.clear();

    if (Slabs.empty())
      return;

    // Reset the state.
    BytesAllocated = 0;
    CurPtr = (char *)Slabs.front();
    End = CurPtr + SlabSize;

    __asan_poison_memory_region(*Slabs.begin(), computeSlabSize(0));
    DeallocateSlabs(std::next(Slabs.begin()), Slabs.end());
    Slabs.erase(std::next(Slabs.begin()), Slabs.end());
  }